

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::detectDominatedCol
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col,
          bool handleSingletonRows)

{
  Result RVar1;
  reference pvVar2;
  int in_EDX;
  long *in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  HighsInt in_stack_00000014;
  anon_class_32_4_9aef3f16 *in_stack_00000018;
  Result __result_3;
  Result __result_2;
  Result __result_1;
  Result __result;
  anon_class_32_4_9aef3f16 weaklyDominatedCol;
  anon_class_32_4_9aef3f16 dominatedCol;
  bool logging_on;
  double colDualLower;
  double colDualUpper;
  undefined8 in_stack_ffffffffffffff08;
  HighsInt direction;
  double in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  HighsInt in_stack_ffffffffffffff1c;
  HighsLinearSumBounds *in_stack_ffffffffffffff20;
  HighsInt col_00;
  anon_class_32_4_9aef3f16 *in_stack_ffffffffffffff28;
  long *plVar3;
  HighsInt direction_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  direction = (HighsInt)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  plVar3 = in_RDI;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX);
  direction_00 = (HighsInt)((ulong)plVar3 >> 0x20);
  HighsLinearSumBounds::getSumLower
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)in_EDX);
  HighsLinearSumBounds::getSumUpper
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
  col_00 = (HighsInt)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
  RVar1 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                    (in_stack_ffffffffffffff28,col_00,
                     (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10,direction);
  if (RVar1 == kOk) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                        (long)in_EDX);
    if (*pvVar2 == '\0') {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
      RVar1 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                        (in_stack_ffffffffffffff28,col_00,
                         (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         in_stack_ffffffffffffff10,direction);
      if (RVar1 == kOk) {
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc)
                            ,(long)in_EDX);
        if (*pvVar2 == '\0') {
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
          RVar1 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                            (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                             (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             direction_00);
          if (RVar1 == kOk) {
            pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (in_RDI + 0xbc),(long)in_EDX);
            if (*pvVar2 == '\0') {
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)in_EDX);
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)in_EDX);
              RVar1 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                                (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr
                                 ,(double)CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),direction_00);
              if (RVar1 == kOk) {
                RVar1 = kOk;
              }
            }
            else {
              RVar1 = kOk;
            }
          }
        }
        else {
          RVar1 = kOk;
        }
      }
    }
    else {
      RVar1 = kOk;
    }
  }
  return RVar1;
}

Assistant:

HPresolve::Result HPresolve::detectDominatedCol(
    HighsPostsolveStack& postsolve_stack, HighsInt col,
    bool handleSingletonRows) {
  assert(!colDeleted[col]);

  // get bounds on column dual
  double colDualUpper =
      -impliedDualRowBounds.getSumLower(col, -model->col_cost_[col]);
  double colDualLower =
      -impliedDualRowBounds.getSumUpper(col, -model->col_cost_[col]);

  const bool logging_on = analysis_.logging_on_;

  auto dominatedCol = [&](HighsInt col, double dualBound, double bound,
                          HighsInt direction) {
    // column is (strongly) dominated if the bounds on the column dual satisfy:
    // 1. lower bound >  dual feasibility tolerance (direction =  1) or
    // 2. upper bound < -dual feasibility tolerance (direction = -1).
    if (direction * dualBound <= options->dual_feasibility_tolerance)
      return Result::kOk;
    // cannot fix to +-infinity -> infeasible
    if (direction * bound == -kHighsInf) return Result::kDualInfeasible;
    if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleDominatedCol);
    // fix variable
    bool unbounded = false;
    if (direction > 0)
      unbounded = fixColToLowerOrUnbounded(postsolve_stack, col);
    else
      unbounded = fixColToUpperOrUnbounded(postsolve_stack, col);
    if (unbounded) {
      // Handle unboundedness
      presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
      return Result::kDualInfeasible;
    }
    analysis_.logging_on_ = logging_on;
    if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDominatedCol);
    // handle row singletons (if requested)
    if (handleSingletonRows)
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    return checkLimits(postsolve_stack);
  };

  auto weaklyDominatedCol = [&](HighsInt col, double dualBound, double bound,
                                double otherBound, HighsInt direction) {
    // column is weakly dominated if the bounds on the column dual satisfy:
    // 1. lower bound >= -dual feasibility tolerance (direction =  1) or
    // 2. upper bound <=  dual feasibility tolerance (direction = -1).
    if (direction * dualBound < -options->dual_feasibility_tolerance)
      return Result::kOk;
    if (direction * bound != -kHighsInf) {
      if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleDominatedCol);
      // fix variable
      bool unbounded = false;
      if (direction > 0)
        unbounded = fixColToLowerOrUnbounded(postsolve_stack, col);
      else
        unbounded = fixColToUpperOrUnbounded(postsolve_stack, col);
      if (unbounded) {
        // Handle unboundedness
        presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
        return Result::kDualInfeasible;
      }
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDominatedCol);
      // handle row singletons (if requested)
      if (handleSingletonRows)
        HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      return checkLimits(postsolve_stack);
    } else if (analysis_.allow_rule_[kPresolveRuleForcingCol]) {
      // get bound on dual (column) activity
      HighsCDouble sum = 0;
      if (direction > 0)
        sum = impliedDualRowBounds.getSumUpperOrig(col);
      else
        sum = impliedDualRowBounds.getSumLowerOrig(col);
      if (sum == 0.0) {
        // remove column and rows
        if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleForcingCol);
        postsolve_stack.forcingColumn(
            col, getColumnVector(col), model->col_cost_[col], otherBound,
            direction < 0, model->integrality_[col] == HighsVarType::kInteger);
        markColDeleted(col);
        HighsInt coliter = colhead[col];
        while (coliter != -1) {
          HighsInt row = Arow[coliter];
          double rhs = direction * Avalue[coliter] > 0.0
                           ? model->row_upper_[row]
                           : model->row_lower_[row];
          coliter = Anext[coliter];

          postsolve_stack.forcingColumnRemovedRow(col, row, rhs,
                                                  getRowVector(row));
          removeRow(row);
        }
        analysis_.logging_on_ = logging_on;
        if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleForcingCol);
        return checkLimits(postsolve_stack);
      }
    }
    return Result::kOk;
  };

  // check for dominated column
  HPRESOLVE_CHECKED_CALL(
      dominatedCol(col, colDualLower, model->col_lower_[col], HighsInt{1}));
  if (colDeleted[col]) return Result::kOk;

  HPRESOLVE_CHECKED_CALL(
      dominatedCol(col, colDualUpper, model->col_upper_[col], HighsInt{-1}));
  if (colDeleted[col]) return Result::kOk;

  // check for weakly dominated column
  HPRESOLVE_CHECKED_CALL(
      weaklyDominatedCol(col, colDualLower, model->col_lower_[col],
                         model->col_upper_[col], HighsInt{1}));
  if (colDeleted[col]) return Result::kOk;

  HPRESOLVE_CHECKED_CALL(
      weaklyDominatedCol(col, colDualUpper, model->col_upper_[col],
                         model->col_lower_[col], HighsInt{-1}));
  return Result::kOk;
}